

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<unsigned_long>::erase
          (RepeatedField<unsigned_long> *this,const_iterator first,const_iterator last)

{
  const_iterator puVar1;
  const_iterator __result;
  iterator puVar2;
  long in_RDX;
  long in_RSI;
  unsigned_long *in_RDI;
  int in_stack_0000001c;
  RepeatedField<unsigned_long> *in_stack_00000020;
  size_type first_offset;
  RepeatedField<unsigned_long> *in_stack_ffffffffffffffc0;
  unsigned_long *in_stack_ffffffffffffffc8;
  
  puVar1 = cbegin((RepeatedField<unsigned_long> *)0x3e360c);
  if (in_RSI != in_RDX) {
    __result = cend(in_stack_ffffffffffffffc0);
    begin((RepeatedField<unsigned_long> *)0x3e364d);
    std::copy<unsigned_long_const*,unsigned_long*>(in_RDI,in_stack_ffffffffffffffc8,__result);
    cbegin((RepeatedField<unsigned_long> *)0x3e3679);
    Truncate(in_stack_00000020,in_stack_0000001c);
  }
  puVar2 = begin((RepeatedField<unsigned_long> *)0x3e369e);
  return puVar2 + (int)(in_RSI - (long)puVar1 >> 3);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}